

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * Cudd_addBddInterval(DdManager *dd,DdNode *f,double lower,double upper)

{
  DdNode *l_00;
  DdNode *u_00;
  DdNode *u;
  DdNode *l;
  DdNode *res;
  double upper_local;
  double lower_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  l_00 = cuddUniqueConst(dd,lower);
  if (l_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)l_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)l_00 & 0xfffffffffffffffe) + 4) + 1;
    u_00 = cuddUniqueConst(dd,upper);
    if (u_00 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,l_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)u_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)u_00 & 0xfffffffffffffffe) + 4) + 1;
      do {
        dd->reordered = 0;
        dd_local = (DdManager *)addBddDoInterval(dd,f,l_00,u_00);
      } while (dd->reordered == 1);
      if (dd_local == (DdManager *)0x0) {
        Cudd_RecursiveDeref(dd,l_00);
        Cudd_RecursiveDeref(dd,u_00);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,l_00);
        Cudd_RecursiveDeref(dd,u_00);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addBddInterval(
  DdManager * dd,
  DdNode * f,
  CUDD_VALUE_TYPE  lower,
  CUDD_VALUE_TYPE  upper)
{
    DdNode *res;
    DdNode *l;
    DdNode *u;
    
    /* Create constant nodes for the interval bounds, so that we can use
    ** the global cache.
    */
    l = cuddUniqueConst(dd,lower);
    if (l == NULL) return(NULL);
    cuddRef(l);
    u = cuddUniqueConst(dd,upper);
    if (u == NULL) {
        Cudd_RecursiveDeref(dd,l);
        return(NULL);
    }
    cuddRef(u);

    do {
        dd->reordered = 0;
        res = addBddDoInterval(dd, f, l, u);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, l);
        Cudd_RecursiveDeref(dd, u);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, l);
    Cudd_RecursiveDeref(dd, u);
    cuddDeref(res);
    return(res);

}